

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::dynamic_string>::~vector(vector<crnlib::dynamic_string> *this)

{
  if (this->m_p != (dynamic_string *)0x0) {
    helpers::destruct_array<crnlib::dynamic_string>(this->m_p,this->m_size);
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }